

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O1

void unroll(lua_State *L,void *ud)

{
  CallInfo *pCVar1;
  int iVar2;
  
  pCVar1 = L->ci;
  while (pCVar1 != &L->base_ci) {
    if ((pCVar1->callstatus & 1) == 0) {
      if ((pCVar1->nresults == -1) && (pCVar1->top < L->top)) {
        pCVar1->top = L->top;
      }
      if ((pCVar1->callstatus & 0x20) == 0) {
        (pCVar1->u).c.status = '\x01';
      }
      pCVar1->callstatus = pCVar1->callstatus & 199 | 8;
      iVar2 = (*(pCVar1->u).c.k)(L);
      luaD_poscall(L,L->top + -(long)iVar2);
    }
    else {
      luaV_finishOp(L);
      luaV_execute(L);
    }
    pCVar1 = L->ci;
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  UNUSED(ud);
  for (;;) {
    if (L->ci == &L->base_ci)  /* stack is empty? */
      return;  /* coroutine finished normally */
    if (!isLua(L->ci))  /* C function? */
      finishCcall(L);
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L);  /* execute down to higher C 'boundary' */
    }
  }
}